

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RamFileManager.cpp
# Opt level: O3

unique_ptr<supermap::io::OutputStream,_std::default_delete<supermap::io::OutputStream>_> __thiscall
supermap::io::RamFileManager::getOutputStream(RamFileManager *this,path *filename,bool append)

{
  pointer pcVar1;
  size_type sVar2;
  StringOutputStream *this_00;
  bool in_CL;
  long lVar3;
  ulong uVar4;
  undefined7 in_register_00000011;
  path *path;
  long lVar5;
  ulong uVar6;
  undefined1 local_90 [32];
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  const_iterator local_50;
  
  path = (path *)CONCAT71(in_register_00000011,append);
  getFileIteratorNoThrow(&local_50,(RamFileManager *)filename,path);
  if (local_50._M_cur == (_Elt_pointer)filename[1]._M_pathname.field_2._M_allocated_capacity) {
    pcVar1 = (path->_M_pathname)._M_dataplus._M_p;
    local_90._0_8_ = local_90 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,pcVar1,pcVar1 + (path->_M_pathname)._M_string_length);
    local_70._M_p = (pointer)&local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    std::
    deque<supermap::io::RamFileManager::File,_std::allocator<supermap::io::RamFileManager::File>_>::
    emplace_back<supermap::io::RamFileManager::File>
              ((deque<supermap::io::RamFileManager::File,_std::allocator<supermap::io::RamFileManager::File>_>
                *)&(filename->_M_pathname)._M_string_length,(File *)local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
      operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
    }
  }
  getFileIterator(&local_50,(RamFileManager *)filename,path);
  lVar3 = *(long *)((long)&(filename->_M_pathname).field_2 + 8);
  sVar2 = filename[1]._M_pathname._M_string_length;
  lVar5 = ((long)filename[1]._M_pathname._M_dataplus._M_p - lVar3 >> 6) +
          ((long)local_50._M_cur - (long)local_50._M_first >> 6) +
          ((long)local_50._M_node + ((ulong)(local_50._M_node != (_Map_pointer)0x0) * -8 - sVar2) &
          0xfffffffffffffff8);
  uVar6 = (lVar3 - *(long *)&filename->_M_cmpts >> 6) + lVar5;
  if ((long)uVar6 < 0) {
    uVar4 = (long)uVar6 >> 3;
  }
  else {
    if (uVar6 < 8) {
      lVar3 = lVar3 + lVar5 * 0x40;
      goto LAB_0010943d;
    }
    uVar4 = uVar6 >> 3;
  }
  lVar3 = (uVar6 + uVar4 * -8) * 0x40 + *(long *)(sVar2 + uVar4 * 8);
LAB_0010943d:
  this_00 = (StringOutputStream *)operator_new(0x198);
  StringOutputStream::StringOutputStream(this_00,(string *)(lVar3 + 0x20),in_CL);
  (this->super_FileManager)._vptr_FileManager = (_func_int **)this_00;
  return (__uniq_ptr_data<supermap::io::OutputStream,_std::default_delete<supermap::io::OutputStream>,_true,_true>
          )(__uniq_ptr_data<supermap::io::OutputStream,_std::default_delete<supermap::io::OutputStream>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<OutputStream> RamFileManager::getOutputStream(const std::filesystem::path &filename, bool append) {
    auto fileIt = getFileIteratorNoThrow(filename);
    if (fileIt == files.end()) {
        files.push_back({filename, ""});
    }
    fileIt = getFileIterator(filename);
    std::size_t fileIndex = fileIt - files.begin();
    return std::make_unique<StringOutputStream>(files[fileIndex].content, append);
}